

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,IdentifierExpr *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  element_type *local_18;
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)&((node->identifier).
                               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->val);
  if (iVar1 == 0) {
    return;
  }
  local_18 = (node->identifier).
             super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->associatedDecl->_M_h,(key_type *)&local_18);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  if ((*(long *)((long)cVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_false>
                       ._M_cur + 0x10) == 0) ||
     (lVar3 = __dynamic_cast(*(long *)((long)cVar2.
                                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_false>
                                             ._M_cur + 0x10),&ast::Declaration::typeinfo,
                             &ast::VarDecl::typeinfo,0), lVar3 == 0)) {
    __assert_fail("decl",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/preprocessor.cpp"
                  ,0x74,
                  "virtual void mocker::RenameASTIdentifiers::operator()(ast::IdentifierExpr &) const"
                 );
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_false>
                    ._M_cur + 0x18);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &((node->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->val)
  ;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void operator()(ast::IdentifierExpr &node) const override {
    if (node.identifier->val == "this")
      return;
    auto decl = std::dynamic_pointer_cast<ast::VarDecl>(
        associatedDecl.at(node.identifier->getID()));
    assert(decl);
    node.identifier->val = decl->decl->identifier->val;
  }